

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationFastLatinBuilder::getCEsFromCE32
          (CollationFastLatinBuilder *this,CollationData *data,UChar32 c,uint32_t ce32,
          UErrorCode *errorCode)

{
  uint32_t *puVar1;
  int64_t *piVar2;
  UBool UVar3;
  uint32_t ce32_00;
  int32_t iVar4;
  int32_t iVar5;
  uint uVar6;
  uint uVar7;
  int64_t iVar8;
  uint32_t sc1;
  uint32_t lower32_1;
  uint32_t p1;
  uint32_t sc0;
  uint32_t lower32_0;
  uint32_t p0;
  int32_t length_1;
  int64_t *ces;
  int32_t length;
  uint32_t *ce32s;
  UErrorCode *errorCode_local;
  uint32_t ce32_local;
  UChar32 c_local;
  CollationData *data_local;
  CollationFastLatinBuilder *this_local;
  
  UVar3 = ::U_FAILURE(*errorCode);
  if (UVar3 != '\0') {
    return '\0';
  }
  ce32_00 = CollationData::getFinalCE32(data,ce32);
  this->ce1 = 0;
  UVar3 = Collation::isSimpleOrLongCE32(ce32_00);
  if (UVar3 == '\0') {
    iVar4 = Collation::tagFromCE32(ce32_00);
    switch(iVar4) {
    case 4:
      iVar8 = Collation::latinCE0FromCE32(ce32_00);
      this->ce0 = iVar8;
      iVar8 = Collation::latinCE1FromCE32(ce32_00);
      this->ce1 = iVar8;
      break;
    case 5:
      puVar1 = data->ce32s;
      iVar4 = Collation::indexFromCE32(ce32_00);
      iVar5 = Collation::lengthFromCE32(ce32_00);
      if (2 < iVar5) {
        return '\0';
      }
      iVar8 = Collation::ceFromCE32(puVar1[iVar4]);
      this->ce0 = iVar8;
      if (iVar5 == 2) {
        iVar8 = Collation::ceFromCE32((puVar1 + iVar4)[1]);
        this->ce1 = iVar8;
      }
      break;
    case 6:
      piVar2 = data->ces;
      iVar4 = Collation::indexFromCE32(ce32_00);
      iVar5 = Collation::lengthFromCE32(ce32_00);
      if (2 < iVar5) {
        return '\0';
      }
      this->ce0 = piVar2[iVar4];
      if (iVar5 == 2) {
        this->ce1 = (piVar2 + iVar4)[1];
      }
      break;
    default:
      return '\0';
    case 9:
      UVar3 = getCEsFromContractionCE32(this,data,ce32_00,errorCode);
      return UVar3;
    case 0xe:
      iVar8 = CollationData::getCEFromOffsetCE32(data,c,ce32_00);
      this->ce0 = iVar8;
    }
  }
  else {
    iVar8 = Collation::ceFromCE32(ce32_00);
    this->ce0 = iVar8;
  }
  if (this->ce0 == 0) {
    return this->ce1 == 0;
  }
  uVar6 = (uint)((ulong)this->ce0 >> 0x20);
  if (uVar6 == 0) {
    return '\0';
  }
  if (uVar6 <= this->lastLatinPrimary) {
    uVar7 = (uint)this->ce0;
    if ((uVar6 < this->firstShortPrimary) && ((uVar7 & 0xffffc000) != 0x5000000)) {
      return '\0';
    }
    if ((uVar7 & 0x3f3f) < 0x500) {
      return '\0';
    }
    if (this->ce1 != 0) {
      uVar7 = (uint)((ulong)this->ce1 >> 0x20);
      if (uVar7 == 0) {
        if (uVar6 < this->firstShortPrimary) {
          return '\0';
        }
      }
      else {
        UVar3 = inSameGroup(this,uVar6,uVar7);
        if (UVar3 == '\0') {
          return '\0';
        }
      }
      uVar6 = (uint)this->ce1;
      if (uVar6 >> 0x10 == 0) {
        return '\0';
      }
      if (((uVar7 != 0) && (uVar7 < this->firstShortPrimary)) && ((uVar6 & 0xffffc000) != 0x5000000)
         ) {
        return '\0';
      }
      if ((uVar6 & 0x3f3f) < 0x500) {
        return '\0';
      }
    }
    return ((this->ce0 | this->ce1) & 0xc0U) == 0;
  }
  return '\0';
}

Assistant:

UBool
CollationFastLatinBuilder::getCEsFromCE32(const CollationData &data, UChar32 c, uint32_t ce32,
                                          UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    ce32 = data.getFinalCE32(ce32);
    ce1 = 0;
    if(Collation::isSimpleOrLongCE32(ce32)) {
        ce0 = Collation::ceFromCE32(ce32);
    } else {
        switch(Collation::tagFromCE32(ce32)) {
        case Collation::LATIN_EXPANSION_TAG:
            ce0 = Collation::latinCE0FromCE32(ce32);
            ce1 = Collation::latinCE1FromCE32(ce32);
            break;
        case Collation::EXPANSION32_TAG: {
            const uint32_t *ce32s = data.ce32s + Collation::indexFromCE32(ce32);
            int32_t length = Collation::lengthFromCE32(ce32);
            if(length <= 2) {
                ce0 = Collation::ceFromCE32(ce32s[0]);
                if(length == 2) {
                    ce1 = Collation::ceFromCE32(ce32s[1]);
                }
                break;
            } else {
                return FALSE;
            }
        }
        case Collation::EXPANSION_TAG: {
            const int64_t *ces = data.ces + Collation::indexFromCE32(ce32);
            int32_t length = Collation::lengthFromCE32(ce32);
            if(length <= 2) {
                ce0 = ces[0];
                if(length == 2) {
                    ce1 = ces[1];
                }
                break;
            } else {
                return FALSE;
            }
        }
        // Note: We could support PREFIX_TAG (assert c>=0)
        // by recursing on its default CE32 and checking that none of the prefixes starts
        // with a fast Latin character.
        // However, currently (2013) there are only the L-before-middle-dot
        // prefix mappings in the Latin range, and those would be rejected anyway.
        case Collation::CONTRACTION_TAG:
            U_ASSERT(c >= 0);
            return getCEsFromContractionCE32(data, ce32, errorCode);
        case Collation::OFFSET_TAG:
            U_ASSERT(c >= 0);
            ce0 = data.getCEFromOffsetCE32(c, ce32);
            break;
        default:
            return FALSE;
        }
    }
    // A mapping can be completely ignorable.
    if(ce0 == 0) { return ce1 == 0; }
    // We do not support an ignorable ce0 unless it is completely ignorable.
    uint32_t p0 = (uint32_t)(ce0 >> 32);
    if(p0 == 0) { return FALSE; }
    // We only support primaries up to the Latin script.
    if(p0 > lastLatinPrimary) { return FALSE; }
    // We support non-common secondary and case weights only together with short primaries.
    uint32_t lower32_0 = (uint32_t)ce0;
    if(p0 < firstShortPrimary) {
        uint32_t sc0 = lower32_0 & Collation::SECONDARY_AND_CASE_MASK;
        if(sc0 != Collation::COMMON_SECONDARY_CE) { return FALSE; }
    }
    // No below-common tertiary weights.
    if((lower32_0 & Collation::ONLY_TERTIARY_MASK) < Collation::COMMON_WEIGHT16) { return FALSE; }
    if(ce1 != 0) {
        // Both primaries must be in the same group,
        // or both must get short mini primaries,
        // or a short-primary CE is followed by a secondary CE.
        // This is so that we can test the first primary and use the same mask for both,
        // and determine for both whether they are variable.
        uint32_t p1 = (uint32_t)(ce1 >> 32);
        if(p1 == 0 ? p0 < firstShortPrimary : !inSameGroup(p0, p1)) { return FALSE; }
        uint32_t lower32_1 = (uint32_t)ce1;
        // No tertiary CEs.
        if((lower32_1 >> 16) == 0) { return FALSE; }
        // We support non-common secondary and case weights
        // only for secondary CEs or together with short primaries.
        if(p1 != 0 && p1 < firstShortPrimary) {
            uint32_t sc1 = lower32_1 & Collation::SECONDARY_AND_CASE_MASK;
            if(sc1 != Collation::COMMON_SECONDARY_CE) { return FALSE; }
        }
        // No below-common tertiary weights.
        if((lower32_1 & Collation::ONLY_TERTIARY_MASK) < Collation::COMMON_WEIGHT16) { return FALSE; }
    }
    // No quaternary weights.
    if(((ce0 | ce1) & Collation::QUATERNARY_MASK) != 0) { return FALSE; }
    return TRUE;
}